

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper16
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7,Var arg8,Var arg9,Var arg10,Var arg11,Var arg12,Var arg13,
              Var arg14,Var arg15,Var arg16)

{
  code *pcVar1;
  void *scriptContext_00;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  long lVar5;
  Var *ppvVar6;
  undefined8 *puVar7;
  byte bVar8;
  anon_class_136_17_1acc1681 in_stack_fffffffffffffea8;
  Var local_c0;
  Var local_b8;
  Var local_b0;
  Var local_a8;
  Var local_a0;
  Var local_98;
  Var local_90;
  Var local_88;
  Var local_80;
  Var local_78;
  Var local_70;
  Var local_68;
  Var local_60;
  Var local_58;
  Var local_50;
  Var local_48;
  Var local_40;
  Var local_38;
  Var arg4_local;
  Var arg3_local;
  Var arg2_local;
  Var arg1_local;
  void *origHelperAddr_local;
  ScriptContext *scriptContext_local;
  
  bVar8 = 0;
  origHelperAddr_local = scriptContext;
  arg1_local = origHelperAddr;
  arg2_local = arg1;
  arg3_local = arg2;
  arg4_local = arg3;
  local_38 = arg4;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xca,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext_00 = origHelperAddr_local;
  local_c0 = arg1_local;
  local_b8 = arg2_local;
  local_b0 = arg3_local;
  local_a8 = arg4_local;
  local_a0 = local_38;
  local_98 = arg5;
  local_90 = arg6;
  local_88 = arg7;
  local_80 = arg8;
  local_78 = arg9;
  local_70 = arg10;
  local_68 = arg11;
  local_60 = arg12;
  local_58 = arg13;
  local_50 = arg14;
  local_48 = arg15;
  local_40 = arg16;
  ppvVar6 = &local_c0;
  puVar7 = (undefined8 *)&stack0xfffffffffffffea8;
  for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppvVar6;
    ppvVar6 = ppvVar6 + (ulong)bVar8 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  pvVar4 = HelperMethodWrapper<Js::HelperMethodWrapper16(Js::ScriptContext*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*)::__0>
                     ((ScriptContext *)scriptContext_00,in_stack_fffffffffffffea8);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper16(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7, Var arg8, Var arg9, Var arg10, Var arg11, Var arg12, Var arg13, Var arg14, Var arg15, Var arg16)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod16)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13, arg14, arg15, arg16);
        });
    }